

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# liveness.c
# Opt level: O3

Vec_Int_t * prepareFlopVector(Aig_Man_t *pAig,int vectorLength)

{
  uint uVar1;
  Vec_Int_t *pVVar2;
  int *__ptr;
  int iVar3;
  int iVar4;
  
  pVVar2 = (Vec_Int_t *)malloc(0x10);
  iVar4 = 0x10;
  if (0xe < vectorLength - 1U) {
    iVar4 = vectorLength;
  }
  pVVar2->nSize = 0;
  pVVar2->nCap = iVar4;
  if (iVar4 == 0) {
    __ptr = (int *)0x0;
  }
  else {
    __ptr = (int *)malloc((long)iVar4 << 2);
  }
  pVVar2->pArray = __ptr;
  if (0 < vectorLength) {
    iVar4 = 0;
    do {
      uVar1 = pVVar2->nSize;
      if (uVar1 == pVVar2->nCap) {
        if ((int)uVar1 < 0x10) {
          if (__ptr == (int *)0x0) {
            __ptr = (int *)malloc(0x40);
          }
          else {
            __ptr = (int *)realloc(__ptr,0x40);
          }
          pVVar2->pArray = __ptr;
          iVar3 = 0x10;
          if (__ptr == (int *)0x0) {
LAB_00634651:
            __assert_fail("p->pArray",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                          ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
          }
        }
        else {
          if (__ptr == (int *)0x0) {
            __ptr = (int *)malloc((ulong)uVar1 * 8);
          }
          else {
            __ptr = (int *)realloc(__ptr,(ulong)uVar1 * 8);
          }
          pVVar2->pArray = __ptr;
          if (__ptr == (int *)0x0) goto LAB_00634651;
          iVar3 = uVar1 * 2;
        }
        pVVar2->nCap = iVar3;
      }
      pVVar2->nSize = uVar1 + 1;
      __ptr[(int)uVar1] = iVar4;
      iVar4 = iVar4 + 1;
    } while (vectorLength != iVar4);
  }
  return pVVar2;
}

Assistant:

Vec_Int_t * prepareFlopVector( Aig_Man_t * pAig, int vectorLength )
{
    Vec_Int_t *vFlops;
    int i;

    vFlops = Vec_IntAlloc( vectorLength );

    for( i=0; i<vectorLength; i++ )
        Vec_IntPush( vFlops, i );

#if 0
    Vec_IntPush( vFlops, 19 );
    Vec_IntPush( vFlops, 20 );
    Vec_IntPush( vFlops, 23 );
    Vec_IntPush( vFlops, 24 );
    //Vec_IntPush( vFlops, 2 );
    //Vec_IntPush( vFlops, 3 );
    //Vec_IntPush( vFlops, 4 );
    //Vec_IntPush( vFlops, 5 );
    //Vec_IntPush( vFlops, 8 );
    //Vec_IntPush( vFlops, 9 );
    //Vec_IntPush( vFlops, 10 );
    //Vec_IntPush( vFlops, 11 );
    //Vec_IntPush( vFlops, 0 );
    //Vec_IntPush( vFlops, 0 );
#endif

    return vFlops;
}